

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

CodeLocation __thiscall
soul::SourceCodeUtilities::findEndOfExpression(SourceCodeUtilities *this,CodeLocation *start)

{
  bool bVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar2;
  CodeLocation CVar3;
  SimpleTokeniser tokeniser;
  
  SimpleTokeniser::SimpleTokeniser(&tokeniser,start,true);
LAB_001eba90:
  do {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&tokeniser.super_SOULTokeniser,(TokenType)0x29b6f4);
    if (bVar1) goto LAB_001ebb15;
    bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)&tokeniser.super_SOULTokeniser,(TokenType)0x275d9e,(TokenType)0x2743e3,
                       (TokenType)0x299119,(TokenType)0x2748be);
    if (bVar1) {
      *(SourceCodeText **)this = tokeniser.super_SOULTokeniser.location.sourceCode.object;
      if (tokeniser.super_SOULTokeniser.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((tokeniser.super_SOULTokeniser.location.sourceCode.object)->super_RefCountedObject).
        refCount = ((tokeniser.super_SOULTokeniser.location.sourceCode.object)->
                   super_RefCountedObject).refCount + 1;
      }
      *(char **)(this + 8) = tokeniser.super_SOULTokeniser.location.location.data;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&tokeniser.super_SOULTokeniser);
      UVar2.data = extraout_RDX_00;
      goto LAB_001ebb52;
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&tokeniser.super_SOULTokeniser,(TokenType)0x29b537);
    if (bVar1) {
      bVar1 = SimpleTokeniser::skipPastMatchingCloseDelimiter
                        ((SimpleTokeniser *)&tokeniser.super_SOULTokeniser,(TokenType)0x29b537,
                         (TokenType)0x299119);
    }
    else {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&tokeniser.super_SOULTokeniser,(TokenType)0x275da0);
      if (!bVar1) {
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::skip(&tokeniser.super_SOULTokeniser);
        goto LAB_001eba90;
      }
      bVar1 = SimpleTokeniser::skipPastMatchingCloseDelimiter
                        ((SimpleTokeniser *)&tokeniser.super_SOULTokeniser,(TokenType)0x275da0,
                         (TokenType)0x2748be);
    }
    if (bVar1 == false) {
LAB_001ebb15:
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&tokeniser.super_SOULTokeniser);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      UVar2.data = extraout_RDX;
LAB_001ebb52:
      CVar3.location.data = UVar2.data;
      CVar3.sourceCode.object = (SourceCodeText *)this;
      return CVar3;
    }
  } while( true );
}

Assistant:

CodeLocation SourceCodeUtilities::findEndOfExpression (CodeLocation start)
{
    try
    {
        SimpleTokeniser tokeniser (start, true);

        while (! tokeniser.matches (Token::eof))
        {
            if (tokeniser.matchesAny (Operator::comma, Operator::semicolon, Operator::closeParen, Operator::closeBrace))
                return tokeniser.location;

            if (tokeniser.matches (Operator::openParen))
            {
                if (! tokeniser.skipPastMatchingCloseDelimiter (Operator::openParen, Operator::closeParen))
                    break;
            }
            else if (tokeniser.matches (Operator::openBrace))
            {
                if (! tokeniser.skipPastMatchingCloseDelimiter (Operator::openBrace, Operator::closeBrace))
                    break;
            }
            else
            {
                tokeniser.skip();
            }
        }
    }
    catch (const AbortCompilationException&) {}

    return {};
}